

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O3

void __thiscall webrtc::GainControlImpl::ReadQueuedRenderData(GainControlImpl *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer puVar3;
  bool bVar4;
  unsigned_long *puVar5;
  string *result;
  ulong samples;
  Handle *state;
  ostream *poVar6;
  unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
  *gain_controller;
  pointer puVar7;
  long lVar8;
  CritScope cs;
  CritScope local_1b0;
  FatalMessage local_1a8;
  
  rtc::CritScope::CritScope(&local_1b0,this->crit_capture_);
  if (this->enabled_ == true) {
    while (bVar4 = SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                   ::Remove((this->render_signal_queue_)._M_t.
                            super___uniq_ptr_impl<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_*,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                            .
                            super__Head_base<0UL,_webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_*,_false>
                            ._M_head_impl,&this->capture_queue_buffer_), bVar4) {
      if ((this->num_proc_channels_).has_value_ == false) {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
                   ,0x9f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Check failed: num_proc_channels_",0x20);
        std::ios::widen((char)(ostream *)&local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ - 0x18))
        ;
        std::ostream::put((char)&local_1a8);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"# ",2);
LAB_0017d3d5:
        rtc::FatalMessage::~FatalMessage(&local_1a8);
      }
      local_1a8._0_8_ = 0;
      puVar5 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
      if ((*puVar5 <= (ulong)local_1a8._0_8_) &&
         (result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                             ((unsigned_long *)&local_1a8,puVar5,"0ul < *num_proc_channels_"),
         result != (string *)0x0)) {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
                   ,0xa0,result);
        goto LAB_0017d3d5;
      }
      psVar1 = (this->capture_queue_buffer_).super__Vector_base<short,_std::allocator<short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->capture_queue_buffer_).super__Vector_base<short,_std::allocator<short>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar5 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
      samples = (ulong)((long)psVar2 - (long)psVar1 >> 1) / *puVar5;
      puVar7 = (this->gain_controllers_).
               super__Vector_base<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->gain_controllers_).
               super__Vector_base<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar7 != puVar3) {
        lVar8 = 0;
        do {
          state = GainController::state
                            ((puVar7->_M_t).
                             super___uniq_ptr_impl<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_webrtc::GainControlImpl::GainController_*,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                             .
                             super__Head_base<0UL,_webrtc::GainControlImpl::GainController_*,_false>
                             ._M_head_impl);
          WebRtcAgc_AddFarend(state,(this->capture_queue_buffer_).
                                    super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar8,samples);
          lVar8 = lVar8 + samples;
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar3);
      }
    }
  }
  rtc::CritScope::~CritScope(&local_1b0);
  return;
}

Assistant:

void GainControlImpl::ReadQueuedRenderData() {
  rtc::CritScope cs(crit_capture_);

  if (!enabled_) {
    return;
  }

  while (render_signal_queue_->Remove(&capture_queue_buffer_)) {
    size_t buffer_index = 0;
    RTC_DCHECK(num_proc_channels_);
    RTC_DCHECK_LT(0ul, *num_proc_channels_);
    const size_t num_frames_per_band =
        capture_queue_buffer_.size() / (*num_proc_channels_);
    for (auto& gain_controller : gain_controllers_) {
      WebRtcAgc_AddFarend(gain_controller->state(),
                          &capture_queue_buffer_[buffer_index],
                          num_frames_per_band);

      buffer_index += num_frames_per_band;
    }
  }
}